

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

float __thiscall
baryonyx::itm::quadratic_cost_type<float>::operator()
          (quadratic_cost_type<float> *this,int index,bit_array *x)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  float local_24;
  
  piVar2 = (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  lVar4 = (long)index;
  local_24 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl[lVar4];
  iVar1 = piVar2[lVar4 + 1];
  for (lVar4 = (long)piVar2[lVar4]; iVar1 != lVar4; lVar4 = lVar4 + 1) {
    iVar3 = bit_array::operator[]
                      (x,(this->quadratic_elements)._M_t.
                         super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                         .
                         super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>
                         ._M_head_impl[lVar4].id);
    if (iVar3 != 0) {
      local_24 = local_24 +
                 (this->quadratic_elements)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                 .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
                 _M_head_impl[lVar4].factor;
    }
  }
  return local_24;
}

Assistant:

Float operator()(int index, const bit_array& x) const noexcept
    {
        Float ret = linear_elements[index];

        auto first = indices[index];
        auto last = indices[index + 1];

        for (; first != last; ++first)
            if (x[quadratic_elements[first].id])
                ret += quadratic_elements[first].factor;

        return ret;
    }